

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_macroblock(h264_slice *slice,h264_macroblock *mb)

{
  int iVar1;
  int iVar2;
  uint local_28;
  uint local_24;
  int n;
  int k;
  int j;
  int i;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  
  printf("\t\tmb_field_decoding_flag = %d\n",(ulong)mb->mb_field_decoding_flag);
  printf("\t\tmb_type = %d [%s]\n",(ulong)mb->mb_type,
         h264_print_macroblock::mbtypenames[mb->mb_type]);
  if (mb->mb_type == 0x19) {
    printf("\t\tLuma PCM:");
    h264_print_pcm(mb->pcm_sample_luma,0x100);
    switch(slice->chroma_array_type) {
    case 0:
      break;
    case 1:
      printf("\t\tChroma PCM:");
      h264_print_pcm(mb->pcm_sample_chroma,0x80);
      break;
    case 2:
      printf("\t\tChroma PCM:");
      h264_print_pcm(mb->pcm_sample_chroma,0x100);
      break;
    case 3:
      printf("\t\tChroma PCM:");
      h264_print_pcm(mb->pcm_sample_chroma,0x200);
    }
  }
  else {
    iVar1 = h264_is_submb_mb_type(mb->mb_type);
    if (iVar1 != 0) {
      for (k = 0; k < 4; k = k + 1) {
        printf("\t\tsub_mb_type[%d] = %d [%s]\n",(ulong)(uint)k,(ulong)mb->sub_mb_type[k],
               h264_print_macroblock::submbtypenames[mb->sub_mb_type[k]]);
      }
    }
    if (mb->mb_type < 0x21) {
      local_28 = (uint)(0x1a < mb->mb_type);
    }
    else {
      local_28 = 2;
    }
    for (k = 0; k < (int)local_28; k = k + 1) {
      printf("\t\tref_idx_l%d =",(ulong)(uint)k);
      for (n = 0; n < 4; n = n + 1) {
        printf(" %d",(ulong)mb->ref_idx[k][n]);
      }
      printf("\n");
      for (local_24 = 0; (int)local_24 < 2; local_24 = local_24 + 1) {
        printf("\t\tmvd_l%d[...][%d] =",(ulong)(uint)k,(ulong)local_24);
        for (n = 0; n < 0x10; n = n + 1) {
          printf(" %d",(ulong)(uint)mb->mvd[k][n][(int)local_24]);
        }
        printf("\n");
      }
    }
    printf("\t\ttransform_size_8x8_flag = %d\n",(ulong)mb->transform_size_8x8_flag);
    printf("\t\tcoded_block_pattern = %d\n",(ulong)mb->coded_block_pattern);
    if ((mb->mb_type == 0) || (mb->mb_type == 0x1a)) {
      if (mb->transform_size_8x8_flag == 0) {
        for (k = 0; k < 0x10; k = k + 1) {
          printf("\t\tprev_intra4x4_pred_mode_flag[%d] = %d\n",(ulong)(uint)k,
                 (ulong)mb->prev_intra4x4_pred_mode_flag[k]);
          if (mb->prev_intra4x4_pred_mode_flag[k] == 0) {
            printf("\t\trem_intra4x4_pred_mode[%d] = %d\n",(ulong)(uint)k,
                   (ulong)mb->rem_intra4x4_pred_mode[k]);
          }
        }
      }
      else {
        for (k = 0; k < 4; k = k + 1) {
          printf("\t\tprev_intra8x8_pred_mode_flag[%d] = %d\n",(ulong)(uint)k,
                 (ulong)mb->prev_intra8x8_pred_mode_flag[k]);
          if (mb->prev_intra8x8_pred_mode_flag[k] == 0) {
            printf("\t\trem_intra8x8_pred_mode[%d] = %d\n",(ulong)(uint)k,
                   (ulong)mb->rem_intra8x8_pred_mode[k]);
          }
        }
      }
    }
    if (mb->mb_type < 0x1b) {
      printf("\t\tintra_chroma_pred_mode = %d\n",(ulong)mb->intra_chroma_pred_mode);
    }
    printf("\t\tmb_qp_delta = %d\n",(ulong)(uint)mb->mb_qp_delta);
    iVar1 = 1;
    if (slice->chroma_array_type == 3) {
      iVar1 = 3;
    }
    iVar2 = h264_is_intra_16x16_mb_type(mb->mb_type);
    if (iVar2 == 0) {
      if (mb->transform_size_8x8_flag == 0) {
        for (k = 0; k < iVar1; k = k + 1) {
          for (n = 0; n < 0x10; n = n + 1) {
            printf("\t\t%s 4x4 %d:",h264_print_macroblock::aname[k],(ulong)(uint)n);
            h264_print_block(mb->block_luma_4x4[k][n],0x10);
          }
        }
      }
      else {
        for (k = 0; k < iVar1; k = k + 1) {
          for (n = 0; n < 4; n = n + 1) {
            printf("\t\t%s 8x8 %d:",h264_print_macroblock::aname[k],(ulong)(uint)n);
            h264_print_block(mb->block_luma_8x8[k][n],0x40);
          }
        }
      }
    }
    else {
      for (k = 0; k < iVar1; k = k + 1) {
        printf("\t\t%s DC:",h264_print_macroblock::aname[k]);
        h264_print_block(mb->block_luma_dc[k],0x10);
        for (n = 0; n < 0x10; n = n + 1) {
          printf("\t\t%s AC %d:",h264_print_macroblock::aname[k],(ulong)(uint)n);
          h264_print_block(mb->block_luma_ac[k][n],0xf);
        }
      }
    }
    if ((slice->chroma_array_type == 1) || (slice->chroma_array_type == 2)) {
      for (k = 0; k < 2; k = k + 1) {
        printf("\t\t%s DC:",h264_print_macroblock::aname[k + 1]);
        h264_print_block(mb->block_chroma_dc[k],slice->chroma_array_type << 2);
        for (n = 0; (uint)n < slice->chroma_array_type << 2; n = n + 1) {
          printf("\t\t%s AC %d:",h264_print_macroblock::aname[k + 1],(ulong)(uint)n);
          h264_print_block(mb->block_chroma_ac[k][n],0xf);
        }
      }
    }
  }
  return;
}

Assistant:

void h264_print_macroblock(struct h264_slice *slice, struct h264_macroblock *mb) {
	static const char *const mbtypenames[] = {
		"I_NxN",
		"I_16X16_0_0_0",
		"I_16X16_1_0_0",
		"I_16X16_2_0_0",
		"I_16X16_3_0_0",
		"I_16X16_0_1_0",
		"I_16X16_1_1_0",
		"I_16X16_2_1_0",
		"I_16X16_3_1_0",
		"I_16X16_0_2_0",
		"I_16X16_1_2_0",
		"I_16X16_2_2_0",
		"I_16X16_3_2_0",
		"I_16X16_0_0_1",
		"I_16X16_1_0_1",
		"I_16X16_2_0_1",
		"I_16X16_3_0_1",
		"I_16X16_0_1_1",
		"I_16X16_1_1_1",
		"I_16X16_2_1_1",
		"I_16X16_3_1_1",
		"I_16X16_0_2_1",
		"I_16X16_1_2_1",
		"I_16X16_2_2_1",
		"I_16X16_3_2_1",
		"I_PCM",
		"SI",
		"P_L0_16X16",
		"P_L0_L0_16X8",
		"P_L0_L0_8X16",
		"P_8X8",
		"P_8X8REF0",
		"P_SKIP",
		"B_DIRECT_16X16",
		"B_L0_16X16",
		"B_L1_16X16",
		"B_BI_16X16",
		"B_L0_L0_16X8",
		"B_L0_L0_8X16",
		"B_L1_L1_16X8",
		"B_L1_L1_8X16",
		"B_L0_L1_16X8",
		"B_L0_L1_8X16",
		"B_L1_L0_16X8",
		"B_L1_L0_8X16",
		"B_L0_BI_16X8",
		"B_L0_BI_8X16",
		"B_L1_BI_16X8",
		"B_L1_BI_8X16",
		"B_BI_L0_16X8",
		"B_BI_L0_8X16",
		"B_BI_L1_16X8",
		"B_BI_L1_8X16",
		"B_BI_BI_16X8",
		"B_BI_BI_8X16",
		"B_8X8",
		"B_SKIP",
		"UNAVAIL",
	};
	static const char *const submbtypenames[] = {
		"P_L0_8X8",
		"P_L0_8X4",
		"P_L0_4X8",
		"P_L0_4X4",
		"B_DIRECT_8X8",
		"B_L0_8X8",
		"B_L1_8X8",
		"B_BI_8X8",
		"B_L0_8X4",
		"B_L0_4X8",
		"B_L1_8X4",
		"B_L1_4X8",
		"B_BI_8X4",
		"B_BI_4X8",
		"B_L0_4X4",
		"B_L1_4X4",
		"B_BI_4X4",
	};
	static const char *const aname[3] = { "Luma", "Cb", "Cr" };
	printf("\t\tmb_field_decoding_flag = %d\n", mb->mb_field_decoding_flag);
	printf("\t\tmb_type = %d [%s]\n", mb->mb_type, mbtypenames[mb->mb_type]);
	int i, j, k;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		printf("\t\tLuma PCM:");
		h264_print_pcm(mb->pcm_sample_luma, 256);
		switch (slice->chroma_array_type) {
			case 0:
				break;
			case 1:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 128);
				break;
			case 2:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 256);
				break;
			case 3:
				printf("\t\tChroma PCM:");
				h264_print_pcm(mb->pcm_sample_chroma, 512);
				break;
		}
	} else {
		if (h264_is_submb_mb_type(mb->mb_type)) {
			for (i = 0; i < 4; i++) {
				printf("\t\tsub_mb_type[%d] = %d [%s]\n", i, mb->sub_mb_type[i], submbtypenames[mb->sub_mb_type[i]]);
			}
		}
		int n;
		if (mb->mb_type >= H264_MB_TYPE_B_BASE)
			n = 2;
		else if (mb->mb_type >= H264_MB_TYPE_P_BASE)
			n = 1;
		else
			n = 0;
		for (i = 0; i < n; i++) {
			printf("\t\tref_idx_l%d =", i);
			for (j = 0; j < 4; j++) {
				printf(" %d", mb->ref_idx[i][j]);
			}
			printf("\n");
			for (k = 0; k < 2; k++) {
				printf("\t\tmvd_l%d[...][%d] =", i, k);
				for (j = 0; j < 16; j++) {
					printf(" %d", mb->mvd[i][j][k]);
				}
				printf("\n");
			}
		}
		printf("\t\ttransform_size_8x8_flag = %d\n", mb->transform_size_8x8_flag);
		printf("\t\tcoded_block_pattern = %d\n", mb->coded_block_pattern);
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
			if (mb->transform_size_8x8_flag) {
				for (i = 0; i < 4; i++) {
					printf("\t\tprev_intra8x8_pred_mode_flag[%d] = %d\n", i, mb->prev_intra8x8_pred_mode_flag[i]);
					if (!mb->prev_intra8x8_pred_mode_flag[i])
						printf("\t\trem_intra8x8_pred_mode[%d] = %d\n", i, mb->rem_intra8x8_pred_mode[i]);
				}
			} else {
				for (i = 0; i < 16; i++) {
					printf("\t\tprev_intra4x4_pred_mode_flag[%d] = %d\n", i, mb->prev_intra4x4_pred_mode_flag[i]);
					if (!mb->prev_intra4x4_pred_mode_flag[i])
						printf("\t\trem_intra4x4_pred_mode[%d] = %d\n", i, mb->rem_intra4x4_pred_mode[i]);
				}
			}
		}
		if (mb->mb_type < H264_MB_TYPE_P_BASE)
			printf("\t\tintra_chroma_pred_mode = %d\n", mb->intra_chroma_pred_mode);
		printf("\t\tmb_qp_delta = %d\n", mb->mb_qp_delta);
		n = (slice->chroma_array_type == 3 ? 3 : 1);
		if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
			for (i = 0; i < n; i++) {
				printf("\t\t%s DC:", aname[i]);
				h264_print_block(mb->block_luma_dc[i], 16);
				for (j = 0; j < 16; j++) {
					printf("\t\t%s AC %d:", aname[i], j);
					h264_print_block(mb->block_luma_ac[i][j], 15);
				}
			}
		} else if (mb->transform_size_8x8_flag) {
			for (i = 0; i < n; i++) {
				for (j = 0; j < 4; j++) {
					printf("\t\t%s 8x8 %d:", aname[i], j);
					h264_print_block(mb->block_luma_8x8[i][j], 64);
				}
			}
		} else {
			for (i = 0; i < n; i++) {
				for (j = 0; j < 16; j++) {
					printf("\t\t%s 4x4 %d:", aname[i], j);
					h264_print_block(mb->block_luma_4x4[i][j], 16);
				}
			}
		}
		if (slice->chroma_array_type == 1 || slice->chroma_array_type == 2) {
			for (i = 0; i < 2; i++) {
				printf("\t\t%s DC:", aname[i+1]);
				h264_print_block(mb->block_chroma_dc[i], slice->chroma_array_type * 4);
				for (j = 0; j < slice->chroma_array_type * 4; j++) {
					printf("\t\t%s AC %d:", aname[i+1], j);
					h264_print_block(mb->block_chroma_ac[i][j], 15);
				}
			}
		}
	}
}